

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

void genBiomeNoise3D(BiomeNoise *bn,int *out,Range r,int opt)

{
  int iVar1;
  int *in_RSI;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_00000020;
  int xi;
  int zj;
  int yk;
  int mid;
  int scale;
  int *p;
  int k;
  int j;
  int i;
  uint32_t flags;
  uint64_t *p_dat;
  uint64_t dat;
  uint32_t in_stack_00000060;
  int *local_40;
  int local_38;
  int local_34;
  int local_30;
  
  local_40 = in_RSI;
  for (local_38 = 0; local_38 < in_stack_00000020; local_38 = local_38 + 1) {
    for (local_34 = 0; local_34 < in_stack_00000018; local_34 = local_34 + 1) {
      for (local_30 = 0; local_30 < in_stack_00000014; local_30 = local_30 + 1) {
        iVar1 = sampleBiomeNoise(_i,_k,p._4_4_,(int)p,scale,_zj,in_stack_00000060);
        *local_40 = iVar1;
        local_40 = local_40 + 1;
      }
    }
  }
  return;
}

Assistant:

static void genBiomeNoise3D(const BiomeNoise *bn, int *out, Range r, int opt)
{
    uint64_t dat = 0;
    uint64_t *p_dat = opt ? &dat : NULL;
    uint32_t flags = opt ? SAMPLE_NO_SHIFT : 0;
    int i, j, k;
    int *p = out;
    int scale = r.scale > 4 ? r.scale / 4 : 1;
    int mid = scale / 2;
    for (k = 0; k < r.sy; k++)
    {
        int yk = (r.y+k);
        for (j = 0; j < r.sz; j++)
        {
            int zj = (r.z+j)*scale + mid;
            for (i = 0; i < r.sx; i++)
            {
                int xi = (r.x+i)*scale + mid;
                *p = sampleBiomeNoise(bn, NULL, xi, yk, zj, p_dat, flags);
                p++;
            }
        }
    }
}